

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseQName(xmlParserCtxtPtr ctxt,xmlChar **prefix)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar2 = xmlParseNCName(ctxt);
  xVar1 = *ctxt->input->cur;
  if (pxVar2 == (xmlChar *)0x0) {
    if (xVar1 != ':') {
      return (xmlChar *)0x0;
    }
    pxVar3 = xmlParseName(ctxt);
    if (pxVar3 == (xmlChar *)0x0) {
      return (xmlChar *)0x0;
    }
    pxVar2 = (xmlChar *)0x0;
    xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s\'\n",pxVar3,(xmlChar *)0x0,
             (xmlChar *)0x0);
  }
  else {
    pxVar3 = pxVar2;
    if (xVar1 == ':') {
      xmlNextChar(ctxt);
      pxVar3 = xmlParseNCName(ctxt);
      if (pxVar3 != (xmlChar *)0x0) {
        if (*ctxt->input->cur == ':') {
          xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s:%s:\'\n",pxVar2,pxVar3,
                   (xmlChar *)0x0);
          xmlNextChar(ctxt);
          pxVar4 = xmlParseName(ctxt);
          if (pxVar4 == (xmlChar *)0x0) {
            if (ctxt->instate == XML_PARSER_EOF) {
              return (xmlChar *)0x0;
            }
            pxVar4 = "";
          }
          pxVar4 = xmlBuildQName(pxVar4,pxVar3,(xmlChar *)0x0,0);
          pxVar3 = xmlDictLookup(ctxt->dict,pxVar4,-1);
          if (pxVar4 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar4);
          }
        }
        goto LAB_001685e5;
      }
      if (ctxt->instate == XML_PARSER_EOF) {
        return (xmlChar *)0x0;
      }
      xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s:\'\n",pxVar2,(xmlChar *)0x0,
               (xmlChar *)0x0);
      pxVar3 = xmlParseNmtoken(ctxt);
      if (pxVar3 == (xmlChar *)0x0) {
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        pxVar2 = xmlBuildQName("",pxVar2,(xmlChar *)0x0,0);
      }
      else {
        pxVar2 = xmlBuildQName(pxVar3,pxVar2,(xmlChar *)0x0,0);
        (*xmlFree)(pxVar3);
      }
      pxVar3 = xmlDictLookup(ctxt->dict,pxVar2,-1);
      if (pxVar2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2);
      }
    }
    pxVar2 = (xmlChar *)0x0;
  }
LAB_001685e5:
  *prefix = pxVar2;
  return pxVar3;
}

Assistant:

static const xmlChar *
xmlParseQName(xmlParserCtxtPtr ctxt, const xmlChar **prefix) {
    const xmlChar *l, *p;

    GROW;

    l = xmlParseNCName(ctxt);
    if (l == NULL) {
        if (CUR == ':') {
	    l = xmlParseName(ctxt);
	    if (l != NULL) {
	        xmlNsErr(ctxt, XML_NS_ERR_QNAME,
		         "Failed to parse QName '%s'\n", l, NULL, NULL);
		*prefix = NULL;
		return(l);
	    }
	}
        return(NULL);
    }
    if (CUR == ':') {
        NEXT;
	p = l;
	l = xmlParseNCName(ctxt);
	if (l == NULL) {
	    xmlChar *tmp;

            if (ctxt->instate == XML_PARSER_EOF)
                return(NULL);
            xmlNsErr(ctxt, XML_NS_ERR_QNAME,
	             "Failed to parse QName '%s:'\n", p, NULL, NULL);
	    l = xmlParseNmtoken(ctxt);
	    if (l == NULL) {
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		tmp = xmlBuildQName(BAD_CAST "", p, NULL, 0);
            } else {
		tmp = xmlBuildQName(l, p, NULL, 0);
		xmlFree((char *)l);
	    }
	    p = xmlDictLookup(ctxt->dict, tmp, -1);
	    if (tmp != NULL) xmlFree(tmp);
	    *prefix = NULL;
	    return(p);
	}
	if (CUR == ':') {
	    xmlChar *tmp;

            xmlNsErr(ctxt, XML_NS_ERR_QNAME,
	             "Failed to parse QName '%s:%s:'\n", p, l, NULL);
	    NEXT;
	    tmp = (xmlChar *) xmlParseName(ctxt);
	    if (tmp != NULL) {
	        tmp = xmlBuildQName(tmp, l, NULL, 0);
		l = xmlDictLookup(ctxt->dict, tmp, -1);
		if (tmp != NULL) xmlFree(tmp);
		*prefix = p;
		return(l);
	    }
            if (ctxt->instate == XML_PARSER_EOF)
                return(NULL);
	    tmp = xmlBuildQName(BAD_CAST "", l, NULL, 0);
	    l = xmlDictLookup(ctxt->dict, tmp, -1);
	    if (tmp != NULL) xmlFree(tmp);
	    *prefix = p;
	    return(l);
	}
	*prefix = p;
    } else
        *prefix = NULL;
    return(l);
}